

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O2

CURLcode Curl_hsts_save(Curl_easy *data,hsts *h,char *file)

{
  void *pvVar1;
  CURLcode CVar2;
  int iVar3;
  CURLSTScode CVar4;
  char *__filename;
  FILE *__stream;
  char *pcVar5;
  Curl_llist_element *pCVar6;
  tm local_b0;
  uchar randsuffix [9];
  curl_index i;
  curl_hstsentry e;
  
  if (h == (hsts *)0x0) {
    return CURLE_OK;
  }
  if (file == (char *)0x0) {
    file = h->filename;
  }
  CVar2 = CURLE_OK;
  if (((file == (char *)0x0) || ((h->flags & 2) != 0)) || (*file == '\0')) goto LAB_00120885;
  CVar2 = Curl_rand_hex(data,randsuffix,9);
  if (CVar2 != CURLE_OK) {
    return CURLE_FAILED_INIT;
  }
  __filename = curl_maprintf("%s.%s.tmp",file,randsuffix);
  if (__filename == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  __stream = fopen64(__filename,"w");
  if (__stream == (FILE *)0x0) {
    CVar2 = CURLE_WRITE_ERROR;
  }
  else {
    fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n# This file was generated by libcurl! Edit at your own risk.\n"
          ,__stream);
    pCVar6 = (h->list).head;
    while (CVar2 = CURLE_OK, pCVar6 != (Curl_llist_element *)0x0) {
      pvVar1 = pCVar6->ptr;
      pCVar6 = pCVar6->next;
      CVar2 = Curl_gmtime(*(time_t *)((long)pvVar1 + 0x28),&local_b0);
      if (CVar2 != CURLE_OK) break;
      pcVar5 = "";
      if (*(char *)((long)pvVar1 + 0x20) != '\0') {
        pcVar5 = ".";
      }
      curl_mfprintf((FILE *)__stream,"%s%s \"%d%02d%02d %02d:%02d:%02d\"\n",pcVar5,
                    *(undefined8 *)((long)pvVar1 + 0x18),(ulong)(local_b0.tm_year + 0x76c),
                    (ulong)(local_b0.tm_mon + 1),(ulong)(uint)local_b0.tm_mday,
                    (ulong)(uint)local_b0.tm_hour,(ulong)(uint)local_b0.tm_min,
                    (ulong)(uint)local_b0.tm_sec);
    }
    fclose(__stream);
    if (CVar2 == CURLE_OK) {
      iVar3 = Curl_rename(__filename,file);
      if (iVar3 == 0) {
        CVar2 = CURLE_OK;
        goto LAB_00120879;
      }
      CVar2 = CURLE_WRITE_ERROR;
    }
    unlink(__filename);
  }
LAB_00120879:
  (*Curl_cfree)(__filename);
LAB_00120885:
  if ((data->set).hsts_write != (curl_hstswrite_callback)0x0) {
    i.total = (h->list).size;
    i.index = 0;
    pCVar6 = (h->list).head;
    while (pCVar6 != (Curl_llist_element *)0x0) {
      pvVar1 = pCVar6->ptr;
      pCVar6 = pCVar6->next;
      e.name = *(char **)((long)pvVar1 + 0x18);
      e.namelen = strlen(e.name);
      e._16_1_ = *(undefined1 *)((long)pvVar1 + 0x20);
      CVar2 = Curl_gmtime(*(time_t *)((long)pvVar1 + 0x28),&local_b0);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      curl_msnprintf(e.expire,0x12,"%d%02d%02d %02d:%02d:%02d",(ulong)(local_b0.tm_year + 0x76c),
                     (ulong)(local_b0.tm_mon + 1),(ulong)(uint)local_b0.tm_mday,
                     (ulong)(uint)local_b0.tm_hour,(ulong)(uint)local_b0.tm_min,
                     (ulong)(uint)local_b0.tm_sec);
      CVar4 = (*(data->set).hsts_write)(data,&e,&i,(data->set).hsts_write_userp);
      if (CVar4 == CURLSTS_FAIL) {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      if (CVar4 != CURLSTS_OK) {
        return CURLE_OK;
      }
      i.index = i.index + 1;
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_hsts_save(struct Curl_easy *data, struct hsts *h,
                        const char *file)
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *n;
  CURLcode result = CURLE_OK;
  FILE *out;
  char *tempstore;
  unsigned char randsuffix[9];

  if(!h)
    /* no cache activated */
    return CURLE_OK;

  /* if no new name is given, use the one we stored from the load */
  if(!file && h->filename)
    file = h->filename;

  if((h->flags & CURLHSTS_READONLYFILE) || !file || !file[0])
    /* marked as read-only, no file or zero length file name */
    goto skipsave;

  if(Curl_rand_hex(data, randsuffix, sizeof(randsuffix)))
    return CURLE_FAILED_INIT;

  tempstore = aprintf("%s.%s.tmp", file, randsuffix);
  if(!tempstore)
    return CURLE_OUT_OF_MEMORY;

  out = fopen(tempstore, FOPEN_WRITETEXT);
  if(!out)
    result = CURLE_WRITE_ERROR;
  else {
    fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n"
          "# This file was generated by libcurl! Edit at your own risk.\n",
          out);
    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      n = e->next;
      result = hsts_out(sts, out);
      if(result)
        break;
    }
    fclose(out);
    if(!result && Curl_rename(tempstore, file))
      result = CURLE_WRITE_ERROR;

    if(result)
      unlink(tempstore);
  }
  free(tempstore);
  skipsave:
  if(data->set.hsts_write) {
    /* if there's a write callback */
    struct curl_index i; /* count */
    i.total = h->list.size;
    i.index = 0;
    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      bool stop;
      n = e->next;
      result = hsts_push(data, &i, sts, &stop);
      if(result || stop)
        break;
      i.index++;
    }
  }
  return result;
}